

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

bool re2::IsAnchorEnd(Regexp **pre,int depth)

{
  uint8_t uVar1;
  Regexp *this;
  bool bVar2;
  ulong uVar3;
  Regexp *pRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  int i;
  long lVar7;
  Regexp *sub;
  PODArray<re2::Regexp_*> subcopy;
  Regexp *local_40;
  unique_ptr<re2::Regexp_*[],_re2::PODArray<re2::Regexp_*>::Deleter> local_38;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) goto LAB_001ac5f7;
  uVar1 = this->op_;
  if (uVar1 == '\x13') {
    pRVar4 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_001ac707:
    *pre = pRVar4;
    Regexp::Decref(this);
LAB_001ac712:
    bVar2 = true;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar5 = &this->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_40 = Regexp::Incref(paVar5->subone_);
      bVar2 = IsAnchorEnd(&local_40,depth + 1);
      if (bVar2) {
        pRVar4 = Regexp::Capture(local_40,(uint)this->parse_flags_,(this->field_7).field_0.max_);
        goto LAB_001ac707;
      }
LAB_001ac726:
      Regexp::Decref(local_40);
    }
    else if ((uVar1 == '\x05') && (uVar3 = (ulong)this->nsub_, uVar3 != 0)) {
      paVar5 = &this->field_5;
      paVar6 = paVar5;
      if (uVar3 != 1) {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_40 = Regexp::Incref(paVar6[uVar3 - 1].subone_);
      bVar2 = IsAnchorEnd(&local_40,depth + 1);
      if (!bVar2) goto LAB_001ac726;
      PODArray<re2::Regexp_*>::PODArray((PODArray<re2::Regexp_*> *)&local_38,(uint)this->nsub_);
      uVar3 = (ulong)this->nsub_;
      local_38._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t
      .super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
      super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[uVar3 - 1] = local_40;
      for (lVar7 = 0; lVar7 < (long)(uVar3 - 1); lVar7 = lVar7 + 1) {
        paVar6 = paVar5;
        if (1 < (ushort)uVar3) {
          paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)paVar5->submany_;
        }
        pRVar4 = Regexp::Incref(paVar6[lVar7].subone_);
        local_38._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[lVar7] = pRVar4;
        uVar3 = (ulong)this->nsub_;
      }
      pRVar4 = Regexp::Concat(local_38._M_t.
                              super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                              .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl,(int)uVar3,
                              (uint)this->parse_flags_);
      *pre = pRVar4;
      Regexp::Decref(this);
      std::unique_ptr<re2::Regexp_*[],_re2::PODArray<re2::Regexp_*>::Deleter>::~unique_ptr
                (&local_38);
      goto LAB_001ac712;
    }
LAB_001ac5f7:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool IsAnchorEnd(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorEnd is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[re->nsub() - 1]->Incref();
        if (IsAnchorEnd(&sub, depth+1)) {
          PODArray<Regexp*> subcopy(re->nsub());
          subcopy[re->nsub() - 1] = sub;  // already have reference
          for (int i = 0; i < re->nsub() - 1; i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy.data(), re->nsub(), re->parse_flags());
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorEnd(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpEndText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}